

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checkqueue.h
# Opt level: O3

void __thiscall
CCheckQueueControl<CScriptCheck>::CCheckQueueControl
          (CCheckQueueControl<CScriptCheck> *this,CCheckQueue<CScriptCheck> *pqueueIn)

{
  long lVar1;
  int iVar2;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this->pqueue = pqueueIn;
  this->fDone = false;
  if (pqueueIn != (CCheckQueue<CScriptCheck> *)0x0) {
    iVar2 = pthread_mutex_lock((pthread_mutex_t *)&pqueueIn->m_control_mutex);
    if (iVar2 != 0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        std::__throw_system_error(iVar2);
      }
      goto LAB_00427926;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
LAB_00427926:
  __stack_chk_fail();
}

Assistant:

explicit CCheckQueueControl(CCheckQueue<T> * const pqueueIn) : pqueue(pqueueIn), fDone(false)
    {
        // passed queue is supposed to be unused, or nullptr
        if (pqueue != nullptr) {
            ENTER_CRITICAL_SECTION(pqueue->m_control_mutex);
        }
    }